

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.hpp
# Opt level: O0

uint Lib::StackHash<Lib::StlHash>::
     hash<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>>
               (Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *s,
               uint hash)

{
  uint h2;
  MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *pMVar1;
  uint in_ESI;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *in_RDI;
  MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *x;
  MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *__end0;
  MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *__begin0;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *__range3;
  MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_> *local_20;
  uint local_c;
  
  local_20 = Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::begin
                       (in_RDI);
  pMVar1 = Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::end
                     (in_RDI);
  local_c = in_ESI;
  for (; local_20 != pMVar1; local_20 = local_20 + 1) {
    h2 = StlHash::hash<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>>
                   (local_20);
    local_c = HashUtils::combine(local_c,h2);
  }
  return local_c;
}

Assistant:

static unsigned hash(const Stack<T>& s, unsigned hash = FNV32_OFFSET_BASIS) {
    for (auto& x : s) {
      hash = HashUtils::combine(hash, ElementHash::hash(x));
    }
    return hash;
  }